

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

TermList Lib::List<Kernel::TermList>::pop(List<Kernel::TermList> **lst)

{
  List<Kernel::TermList> *pLVar1;
  TermList TVar2;
  undefined8 *in_RDI;
  List<Kernel::TermList> *tail;
  TermList result;
  size_t in_stack_ffffffffffffffd8;
  
  pLVar1 = List<Kernel::TermList>::tail((List<Kernel::TermList> *)*in_RDI);
  TVar2 = head((List<Kernel::TermList> *)*in_RDI);
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete((void *)*in_RDI,in_stack_ffffffffffffffd8);
  }
  *in_RDI = pLVar1;
  return (TermList)TVar2._content;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }